

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_fs_scandir_next(uv_fs_t *req,uv_dirent_t *ent)

{
  uint uVar1;
  void *__ptr;
  long lVar2;
  uint *puVar3;
  uint *nbufs;
  uv__dirent_t *dent;
  uv__dirent_t **dents;
  uv_dirent_t *ent_local;
  uv_fs_t *req_local;
  
  puVar3 = uv__get_nbufs(req);
  __ptr = req->ptr;
  if (*puVar3 != 0) {
    free(*(void **)((long)__ptr + (ulong)(*puVar3 - 1) * 8));
  }
  if (*puVar3 == (uint)req->result) {
    free(__ptr);
    req->ptr = (void *)0x0;
    req_local._4_4_ = -0xfff;
  }
  else {
    uVar1 = *puVar3;
    *puVar3 = uVar1 + 1;
    lVar2 = *(long *)((long)__ptr + (ulong)uVar1 * 8);
    ent->name = (char *)(lVar2 + 0x13);
    switch(*(undefined1 *)(lVar2 + 0x12)) {
    case 1:
      ent->type = UV_DIRENT_FIFO;
      break;
    case 2:
      ent->type = UV_DIRENT_CHAR;
      break;
    default:
      ent->type = UV_DIRENT_UNKNOWN;
      break;
    case 4:
      ent->type = UV_DIRENT_DIR;
      break;
    case 6:
      ent->type = UV_DIRENT_BLOCK;
      break;
    case 8:
      ent->type = UV_DIRENT_FILE;
      break;
    case 10:
      ent->type = UV_DIRENT_LINK;
      break;
    case 0xc:
      ent->type = UV_DIRENT_SOCKET;
    }
    req_local._4_4_ = 0;
  }
  return req_local._4_4_;
}

Assistant:

int uv_fs_scandir_next(uv_fs_t* req, uv_dirent_t* ent) {
  uv__dirent_t** dents;
  uv__dirent_t* dent;

  unsigned int* nbufs = uv__get_nbufs(req);

  dents = req->ptr;

  /* Free previous entity */
  if (*nbufs > 0)
    uv__fs_scandir_free(dents[*nbufs - 1]);

  /* End was already reached */
  if (*nbufs == (unsigned int) req->result) {
    uv__fs_scandir_free(dents);
    req->ptr = NULL;
    return UV_EOF;
  }

  dent = dents[(*nbufs)++];

  ent->name = dent->d_name;
#ifdef HAVE_DIRENT_TYPES
  switch (dent->d_type) {
    case UV__DT_DIR:
      ent->type = UV_DIRENT_DIR;
      break;
    case UV__DT_FILE:
      ent->type = UV_DIRENT_FILE;
      break;
    case UV__DT_LINK:
      ent->type = UV_DIRENT_LINK;
      break;
    case UV__DT_FIFO:
      ent->type = UV_DIRENT_FIFO;
      break;
    case UV__DT_SOCKET:
      ent->type = UV_DIRENT_SOCKET;
      break;
    case UV__DT_CHAR:
      ent->type = UV_DIRENT_CHAR;
      break;
    case UV__DT_BLOCK:
      ent->type = UV_DIRENT_BLOCK;
      break;
    default:
      ent->type = UV_DIRENT_UNKNOWN;
  }
#else
  ent->type = UV_DIRENT_UNKNOWN;
#endif

  return 0;
}